

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Summary.cpp
# Opt level: O0

void xmrig::Summary::print(Controller *controller)

{
  Config *pCVar1;
  Base *in_RDI;
  Pools *in_stack_00000060;
  Config *in_stack_00000070;
  BaseConfig *in_stack_00000180;
  
  Base::config(in_RDI);
  BaseConfig::printVersions(in_stack_00000180);
  pCVar1 = Base::config(in_RDI);
  print_memory(pCVar1);
  Base::config(in_RDI);
  print_cpu(in_stack_00000070);
  pCVar1 = Base::config(in_RDI);
  BaseConfig::pools(&pCVar1->super_BaseConfig);
  Pools::print(in_stack_00000060);
  Base::config(in_RDI);
  print_commands((Config *)0x23d382);
  return;
}

Assistant:

void xmrig::Summary::print(Controller *controller)
{
    controller->config()->printVersions();
    print_memory(controller->config());
    print_cpu(controller->config());
    controller->config()->pools().print();
    print_commands(controller->config());
}